

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate __thiscall QDate::addDays(QDate *this,qint64 ndays)

{
  bool bVar1;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar2;
  longlong in_RSI;
  QDate *in_RDI;
  long in_FS_OFFSET;
  qint64 r;
  QDate *jd_;
  undefined1 *local_18;
  qint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  jd_ = in_RDI;
  bVar1 = isNull((QDate *)0x5662ef);
  if (bVar1) {
    QDate(in_RDI);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    eVar2 = qAddOverflow<long_long>(in_RDI->jd,in_RSI,(longlong *)&local_18);
    if (eVar2) {
      QDate(in_RDI);
    }
    else {
      local_10 = (qint64)fromJulianDay((qint64)jd_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDate)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addDays(qint64 ndays) const
{
    if (isNull())
        return QDate();

    if (qint64 r; Q_UNLIKELY(qAddOverflow(jd, ndays, &r)))
        return QDate();
    else
        return fromJulianDay(r);
}